

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int reparse_additive_expr(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t exp_idx_00;
  ushort uVar1;
  int iVar2;
  uint16_t exp_idx_01;
  
  exp_idx_00 = *exp_idx;
  exp_idx_01 = exp_idx_00;
  do {
    iVar2 = reparse_unary_expr(ctx,exp,exp_idx);
    if (iVar2 != 0) {
      return -1;
    }
    while( true ) {
      uVar1 = *exp_idx;
      if (exp->used == uVar1) {
        return 0;
      }
      if (exp->tokens[uVar1] != LYXP_TOKEN_OPERATOR_MATH) {
        return 0;
      }
      if ((exp->expr[exp->expr_pos[uVar1]] != '*') && (exp->tok_len[uVar1] != 3)) break;
      exp_repeat_push(exp,exp_idx_01,6);
      *exp_idx = *exp_idx + 1;
      iVar2 = reparse_unary_expr(ctx,exp,exp_idx);
      if (iVar2 != 0) {
        return -1;
      }
    }
    if ((exp->expr[exp->expr_pos[uVar1]] != '-') && (exp->expr[exp->expr_pos[uVar1]] != '+')) {
      return 0;
    }
    exp_repeat_push(exp,exp_idx_00,5);
    exp_idx_01 = *exp_idx + 1;
    *exp_idx = exp_idx_01;
  } while( true );
}

Assistant:

static int
reparse_additive_expr(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_add_exp, prev_mul_exp;

    prev_add_exp = *exp_idx;
    goto reparse_multiplicative_expr;

    /* ('+' / '-' MultiplicativeExpr)* */
    while (!exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
            && ((exp->expr[exp->expr_pos[*exp_idx]] == '+') || (exp->expr[exp->expr_pos[*exp_idx]] == '-'))) {
        exp_repeat_push(exp, prev_add_exp, LYXP_EXPR_ADDITIVE);
        ++(*exp_idx);

reparse_multiplicative_expr:
        /* UnaryExpr */
        prev_mul_exp = *exp_idx;
        if (reparse_unary_expr(ctx, exp, exp_idx)) {
            return -1;
        }

        /* ('*' / 'div' / 'mod' UnaryExpr)* */
        while (!exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
                && ((exp->expr[exp->expr_pos[*exp_idx]] == '*') || (exp->tok_len[*exp_idx] == 3))) {
            exp_repeat_push(exp, prev_mul_exp, LYXP_EXPR_MULTIPLICATIVE);
            ++(*exp_idx);

            if (reparse_unary_expr(ctx, exp, exp_idx)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}